

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas3_d.cpp
# Opt level: O3

void dtrmm(char side,char uplo,char transa,char diag,int m,int n,double alpha,double *a,int lda,
          double *b,int ldb)

{
  char ca;
  char ca_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ulong uVar4;
  undefined7 in_register_00000039;
  ulong uVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  double *pdVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  string local_98;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  double local_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  bool local_58;
  undefined7 uStack_57;
  char local_49;
  ulong local_48;
  ulong local_40;
  char local_31;
  
  _local_60 = CONCAT44(uStack_5c,(int)CONCAT71(in_register_00000011,transa));
  _local_70 = CONCAT44(uStack_6c,(int)CONCAT71(in_register_00000039,side));
  local_68 = alpha;
  bVar1 = lsame(side,'L');
  local_74 = (undefined4)CONCAT71(in_register_00000009,diag);
  local_31 = lsame(diag,'N');
  bVar2 = lsame(uplo,'U');
  _local_58 = CONCAT71(uStack_57,bVar2);
  local_49 = bVar1;
  local_48 = (ulong)(uint)n;
  local_40 = (ulong)(uint)m;
  if (!bVar1) {
    bVar1 = lsame((char)local_70,'R');
    iVar12 = 1;
    m = n;
    if (!bVar1) goto LAB_00215749;
  }
  if (local_58 == false) {
    bVar1 = lsame(uplo,'L');
    iVar12 = 2;
    if (!bVar1) goto LAB_00215749;
  }
  ca_00 = (char)local_60;
  bVar1 = lsame((char)local_60,'N');
  if ((!bVar1) && (bVar1 = lsame(ca_00,'T'), !bVar1)) {
    bVar1 = lsame(ca_00,'C');
    iVar12 = 3;
    if (!bVar1) goto LAB_00215749;
  }
  ca = (char)local_74;
  bVar1 = lsame((char)local_74,'U');
  if (!bVar1) {
    bVar1 = lsame(ca,'N');
    iVar12 = 4;
    if (!bVar1) goto LAB_00215749;
  }
  if ((int)local_40 < 0) {
    iVar12 = 5;
  }
  else if ((int)local_48 < 0) {
    iVar12 = 6;
  }
  else {
    iVar3 = i4_max(1,m);
    iVar12 = 9;
    if (iVar3 <= lda) {
      iVar3 = i4_max(1,(int)local_40);
      iVar12 = 0xb;
      if (iVar3 <= ldb) {
        if ((int)local_48 == 0) {
          return;
        }
        if ((local_68 == 0.0) && (!NAN(local_68))) {
          uVar8 = local_40 & 0xffffffff;
          uVar16 = local_48 & 0xffffffff;
          iVar12 = 0;
          do {
            if ((int)local_40 != 0) {
              memset(b + iVar12,0,uVar8 << 3);
            }
            iVar12 = iVar12 + ldb;
            uVar16 = uVar16 - 1;
          } while (uVar16 != 0);
          return;
        }
        if (local_49 == '\0') {
          bVar1 = lsame(ca_00,'n');
          if (!bVar1) {
            uVar8 = local_40 & 0xffffffff;
            if (local_58 != false) {
              uVar16 = 0;
              pdVar6 = b;
              do {
                if (uVar16 != 0) {
                  uVar14 = 0;
                  pdVar7 = b;
                  do {
                    dVar17 = a[uVar16 * (long)lda + uVar14];
                    if (((dVar17 != 0.0) || (NAN(dVar17))) && ((int)local_40 != 0)) {
                      uVar4 = 0;
                      do {
                        pdVar7[uVar4] = pdVar6[uVar4] * dVar17 * local_68 + pdVar7[uVar4];
                        uVar4 = uVar4 + 1;
                      } while (uVar8 != uVar4);
                    }
                    uVar14 = uVar14 + 1;
                    pdVar7 = pdVar7 + ldb;
                  } while (uVar14 != uVar16);
                }
                dVar17 = local_68;
                if (local_31 != '\0') {
                  dVar17 = a[(lda + 1) * (int)uVar16] * local_68;
                }
                if (dVar17 != 1.0 && (int)local_40 != 0) {
                  uVar14 = 0;
                  do {
                    pdVar6[uVar14] = pdVar6[uVar14] * dVar17;
                    uVar14 = uVar14 + 1;
                  } while (uVar8 != uVar14);
                }
                uVar16 = uVar16 + 1;
                pdVar6 = pdVar6 + ldb;
              } while (uVar16 != (local_48 & 0xffffffff));
              return;
            }
            uVar14 = local_48 & 0xffffffff;
            lVar11 = (long)ldb;
            pdVar6 = b + (uVar14 - 1) * lVar11;
            pdVar7 = b + lVar11 * uVar14;
            uVar16 = uVar14;
            do {
              uVar4 = uVar16 - 1;
              if ((long)uVar16 < (long)uVar14) {
                pdVar13 = pdVar7;
                uVar9 = uVar16;
                do {
                  dVar17 = a[uVar4 * (long)lda + uVar9];
                  if (((dVar17 != 0.0) || (NAN(dVar17))) && ((int)local_40 != 0)) {
                    uVar5 = 0;
                    do {
                      pdVar13[uVar5] = pdVar6[uVar5] * dVar17 * local_68 + pdVar13[uVar5];
                      uVar5 = uVar5 + 1;
                    } while (uVar8 != uVar5);
                  }
                  uVar9 = uVar9 + 1;
                  pdVar13 = pdVar13 + lVar11;
                } while ((int)uVar9 != (int)local_48);
              }
              dVar17 = local_68;
              if (local_31 != '\0') {
                dVar17 = a[(lda + 1) * (int)uVar4] * local_68;
              }
              if (dVar17 != 1.0 && (int)local_40 != 0) {
                uVar9 = 0;
                do {
                  pdVar6[uVar9] = pdVar6[uVar9] * dVar17;
                  uVar9 = uVar9 + 1;
                } while (uVar8 != uVar9);
              }
              pdVar6 = pdVar6 + -lVar11;
              pdVar7 = pdVar7 + -lVar11;
              bVar1 = 1 < (long)uVar16;
              uVar16 = uVar4;
            } while (bVar1);
            return;
          }
          lVar11 = (long)ldb;
          uVar8 = local_48 & 0xffffffff;
          uVar16 = local_40 & 0xffffffff;
          if (local_58 != false) {
            uVar14 = (ulong)((int)local_48 - 1);
            pdVar6 = b + (uVar8 - 1) * lVar11;
            do {
              uVar4 = uVar8 - 1;
              dVar17 = local_68;
              if (local_31 != '\0') {
                dVar17 = a[(lda + 1) * (int)uVar4] * local_68;
              }
              if ((int)local_40 != 0) {
                uVar9 = 0;
                do {
                  pdVar6[uVar9] = pdVar6[uVar9] * dVar17;
                  uVar9 = uVar9 + 1;
                } while (uVar16 != uVar9);
              }
              if ((long)uVar8 < 2) {
                return;
              }
              uVar9 = 0;
              pdVar7 = b;
              do {
                dVar17 = a[uVar4 * (long)lda + uVar9];
                if (((dVar17 != 0.0) || (NAN(dVar17))) && ((int)local_40 != 0)) {
                  uVar5 = 0;
                  do {
                    pdVar6[uVar5] = pdVar7[uVar5] * dVar17 * local_68 + pdVar6[uVar5];
                    uVar5 = uVar5 + 1;
                  } while (uVar16 != uVar5);
                }
                uVar9 = uVar9 + 1;
                pdVar7 = pdVar7 + lVar11;
              } while (uVar9 != uVar14);
              uVar14 = uVar14 - 1;
              pdVar6 = pdVar6 + -lVar11;
              bVar1 = 1 < (long)uVar8;
              uVar8 = uVar4;
            } while (bVar1);
            return;
          }
          pdVar6 = b + lVar11;
          uVar4 = 1;
          uVar14 = 0;
          do {
            dVar17 = local_68;
            if (local_31 != '\0') {
              dVar17 = a[(lda + 1) * (int)uVar14] * local_68;
            }
            if ((int)local_40 != 0) {
              uVar9 = 0;
              do {
                b[uVar9] = b[uVar9] * dVar17;
                uVar9 = uVar9 + 1;
              } while (uVar16 != uVar9);
            }
            uVar9 = uVar14 + 1;
            if (uVar9 < uVar8) {
              uVar5 = uVar4;
              pdVar7 = pdVar6;
              do {
                dVar17 = a[uVar14 * (long)lda + uVar5];
                if (((dVar17 != 0.0) || (NAN(dVar17))) && ((int)local_40 != 0)) {
                  uVar15 = 0;
                  do {
                    b[uVar15] = pdVar7[uVar15] * dVar17 * local_68 + b[uVar15];
                    uVar15 = uVar15 + 1;
                  } while (uVar16 != uVar15);
                }
                uVar5 = uVar5 + 1;
                pdVar7 = pdVar7 + lVar11;
              } while (uVar5 != uVar8);
            }
            uVar4 = uVar4 + 1;
            b = b + lVar11;
            pdVar6 = pdVar6 + lVar11;
            uVar14 = uVar9;
          } while (uVar9 != uVar8);
          return;
        }
        bVar1 = lsame(ca_00,'N');
        iVar12 = lda + 1;
        if (bVar1) {
          if (local_58 != false) {
            uVar8 = 0;
            pdVar6 = b;
            do {
              if ((int)local_40 != 0) {
                lVar11 = uVar8 * (long)ldb;
                uVar16 = 0;
                pdVar7 = a;
                do {
                  dVar17 = b[lVar11 + uVar16];
                  if ((dVar17 != 0.0) || (NAN(dVar17))) {
                    dVar17 = dVar17 * local_68;
                    if (uVar16 != 0) {
                      uVar14 = 0;
                      do {
                        pdVar6[uVar14] = pdVar7[uVar14] * dVar17 + pdVar6[uVar14];
                        uVar14 = uVar14 + 1;
                      } while (uVar16 != uVar14);
                    }
                    if (local_31 != '\0') {
                      dVar17 = dVar17 * a[iVar12 * (int)uVar16];
                    }
                    b[lVar11 + uVar16] = dVar17;
                  }
                  uVar16 = uVar16 + 1;
                  pdVar7 = pdVar7 + lda;
                } while (uVar16 != (local_40 & 0xffffffff));
              }
              uVar8 = uVar8 + 1;
              pdVar6 = pdVar6 + ldb;
            } while (uVar8 != (local_48 & 0xffffffff));
            return;
          }
          uVar8 = local_40 & 0xffffffff;
          pdVar6 = b + uVar8;
          uVar16 = 0;
          do {
            if ((int)local_40 != 0) {
              lVar11 = uVar16 * (long)ldb;
              iVar3 = 0;
              uVar14 = uVar8;
              pdVar7 = a + (uVar8 - 1) * (long)lda + uVar8;
              pdVar13 = pdVar6;
              do {
                uVar4 = uVar14 - 1;
                dVar17 = b[lVar11 + (uVar14 - 1)];
                if ((dVar17 != 0.0) || (NAN(dVar17))) {
                  dVar17 = dVar17 * local_68;
                  b[lVar11 + uVar4] = dVar17;
                  if (local_31 != '\0') {
                    b[lVar11 + uVar4] = a[iVar12 * (int)uVar4] * dVar17;
                  }
                  if ((long)uVar14 < (long)uVar8) {
                    lVar10 = 0;
                    do {
                      pdVar13[lVar10] = pdVar7[lVar10] * dVar17 + pdVar13[lVar10];
                      lVar10 = lVar10 + 1;
                    } while (iVar3 != (int)lVar10);
                  }
                }
                pdVar7 = pdVar7 + ~(long)lda;
                pdVar13 = pdVar13 + -1;
                iVar3 = iVar3 + 1;
                bVar1 = 1 < (long)uVar14;
                uVar14 = uVar4;
              } while (bVar1);
            }
            uVar16 = uVar16 + 1;
            pdVar6 = pdVar6 + ldb;
          } while (uVar16 != (local_48 & 0xffffffff));
          return;
        }
        if (local_58 == false) {
          uVar8 = local_40 & 0xffffffff;
          uVar16 = 0;
          pdVar6 = b;
          do {
            if ((int)local_40 != 0) {
              lVar11 = uVar16 * (long)ldb;
              uVar14 = 0;
              pdVar7 = a;
              pdVar13 = pdVar6;
              uVar4 = uVar8;
              do {
                dVar17 = b[lVar11 + uVar14];
                if (local_31 != '\0') {
                  dVar17 = dVar17 * a[iVar12 * (int)uVar14];
                }
                uVar9 = uVar14 + 1;
                if (uVar9 < uVar8) {
                  uVar5 = 1;
                  do {
                    dVar17 = dVar17 + pdVar7[uVar5] * pdVar13[uVar5];
                    uVar5 = uVar5 + 1;
                  } while (uVar4 != uVar5);
                }
                b[lVar11 + uVar14] = dVar17 * local_68;
                pdVar13 = pdVar13 + 1;
                pdVar7 = pdVar7 + (long)lda + 1;
                uVar4 = uVar4 - 1;
                uVar14 = uVar9;
              } while (uVar9 != uVar8);
            }
            uVar16 = uVar16 + 1;
            pdVar6 = pdVar6 + ldb;
          } while (uVar16 != (local_48 & 0xffffffff));
          return;
        }
        uVar8 = 0;
        pdVar6 = b;
        do {
          if ((int)local_40 != 0) {
            lVar11 = uVar8 * (long)ldb;
            uVar16 = (ulong)((int)local_40 - 1);
            uVar14 = local_40 & 0xffffffff;
            pdVar7 = a + ((local_40 & 0xffffffff) - 1) * (long)lda;
            do {
              uVar4 = uVar14 - 1;
              dVar17 = b[lVar11 + (uVar14 - 1)];
              if (local_31 != '\0') {
                dVar17 = dVar17 * a[iVar12 * (int)uVar4];
              }
              if ((long)uVar14 < 2) {
                b[lVar11 + uVar4] = dVar17 * local_68;
                break;
              }
              uVar9 = 0;
              do {
                dVar17 = dVar17 + pdVar7[uVar9] * pdVar6[uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar16 != uVar9);
              b[lVar11 + uVar4] = dVar17 * local_68;
              uVar16 = uVar16 - 1;
              pdVar7 = pdVar7 + -(long)lda;
              bVar1 = 1 < (long)uVar14;
              uVar14 = uVar4;
            } while (bVar1);
          }
          uVar8 = uVar8 + 1;
          pdVar6 = pdVar6 + ldb;
          if (uVar8 == (local_48 & 0xffffffff)) {
            return;
          }
        } while( true );
      }
    }
  }
LAB_00215749:
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"DTRMM","");
  xerbla(&local_98,iVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void dtrmm ( char side, char uplo, char transa, char diag, int m, int n, 
  double alpha, double a[], int lda, double b[], int ldb )

//****************************************************************************80
//
//  Purpose:
//
//    DTRMM performs B:=A*B or B:=B*A, A triangular, B rectangular.
//
//  Discussion:
//
//    This routine performs one of the matrix-matrix operations
//      B := alpha*op( A )*B,
//    or
//      B := alpha*B*op( A ),
//    where  alpha  is a scalar,  B  is an m by n matrix,  A  is a unit, or
//    non-unit,  upper or lower triangular matrix  and  op( A )  is one  of
//      op( A ) = A   or   op( A ) = A'.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 April 2014
//
//  Author:
//
//    This C++ version by John Burkardt.
//
//  Parameters:
//
//    Input, char SIDE, specifies whether op(A) multiplies B from
//    the left or right as follows:
//    'L' or 'l': B := alpha*op( A )*B.
//    'R' or 'r': B := alpha*B*op( A ).
//
//    Input, char UPLO, specifies whether the matrix A is an upper or
//    lower triangular matrix as follows:
//    'U' or 'u': A is an upper triangular matrix.
//    'L' or 'l': A is a lower triangular matrix.
//
//    Input, char TRANS, specifies the form of op( A ) to be used in
//    the matrix multiplication as follows:
//    'N' or 'n': op( A ) = A.
//    'T' or 't': op( A ) = A'.
//    'C' or 'c': op( A ) = A'.
//
//    Input, char DIAG, specifies whether or not A is unit triangular
//    as follows:
//    'U' or 'u': A is assumed to be unit triangular.
//    'N' or 'n': A is not assumed to be unit triangular.
//
//    Input, int M, the number of rows of B.  0 <= M.
//
//    Input, int N, the number of columns of B.  
//    0 <= N.
//
//    Input, double ALPHA, the scalar  alpha.  When alpha is
//    0.0, A is not referenced and B need not be set before entry.
//
//    Input, double A[LDA*K], where k is m when  SIDE = 'L' or 'l'  
//    and is  n  when  SIDE = 'R' or 'r'.
//    Before entry  with  UPLO = 'U' or 'u',  the  leading  k by k
//    upper triangular part of the array  A must contain the upper
//    triangular matrix  and the strictly lower triangular part of
//    A is not referenced.
//    Before entry  with  UPLO = 'L' or 'l',  the  leading  k by k
//    lower triangular part of the array  A must contain the lower
//    triangular matrix  and the strictly upper triangular part of
//    A is not referenced.
//    Note that when  DIAG = 'U' or 'u',  the diagonal elements of
//    A  are not referenced either,  but are assumed to be  unity.
//
//    Input, integer LDA, the first dimension of A as declared
//    in the calling program.  When SIDE = 'L' or 'l' then LDA must be at 
//    least max ( 1, M ); when SIDE = 'R' or 'r', LDA must be at least 
//    max ( 1, N ).
//
//    Input/output, double B[LDB*N].
//    Before entry, the leading m by n part of the array  B must contain 
//    the matrix  B, and on exit is overwritten by the transformed matrix.
//
//    Input, integer LDB, the first dimension of B as declared
//    in the calling program.   max ( 1, M ) <= LDB.
//
{
  int i;
  int info;
  int j;
  int k;
  int lside;
  int nounit;
  int nrowa;
  double temp;
  int upper;
//
//  Test the input parameters.
//
  lside = lsame ( side, 'L' );

  if ( lside )
  {
    nrowa = m;
  }
  else
  {
    nrowa = n;
  }

  nounit = lsame ( diag, 'N' );
  upper = lsame ( uplo, 'U' );

  info = 0;
  if ( ! lside && ! lsame ( side, 'R' ) )
  {
    info = 1;
  }
  else if ( ! upper && ! lsame ( uplo, 'L' ) )
  {
    info = 2;
  }
  else if ( ! lsame ( transa, 'N' ) && ! lsame ( transa, 'T' ) && 
            ! lsame ( transa, 'C' ) )
  {
    info = 3;
  }
  else if ( ! lsame ( diag, 'U' ) && ! lsame ( diag, 'N' ) )
  {
    info = 4;
  }
  else if ( m < 0 )
  {
    info = 5;
  }
  else if ( n < 0 )
  {
    info = 6;
  }
  else if ( lda < i4_max ( 1, nrowa ) )
  {
    info = 9;
  }
  else if ( ldb < i4_max ( 1, m ) )
  {
    info = 11;
  }

  if ( info != 0 ) 
  {
    xerbla ( "DTRMM", info );
    return;
  }
//
//  Quick return if possible.
//
  if ( n == 0 )
  {
    return;
  }
//
//  And when alpha is 0.0.
//
  if ( alpha == 0.0 )
  {
    for ( j = 0; j < n; j++ )
    {
      for ( i = 0; i < m; i++ )
      {
        b[i+j*ldb] = 0.0;
      }
    }
    return;
  }
//
//  Start the operations.
//
  if ( lside )
  {
//
//  Form  B := alpha*A*B.
//
    if ( lsame ( transa, 'N' ) )
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          for ( k = 0; k < m; k++ )
          {
            if ( b[k+j*ldb] != 0.0 )
            {
              temp = alpha * b[k+j*ldb];
              for ( i = 0; i < k; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * a[i+k*lda];
              }
              if ( nounit )
              {
                temp = temp * a[k+k*lda];
              }
              b[k+j*ldb] = temp;
            }
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          for ( k = m - 1; 0 <= k; k-- )
          {
            if ( b[k+j*ldb] != 0.0 )
            {
              temp = alpha * b[k+j*ldb];
              b[k+j*ldb] = temp;
              if ( nounit )
              {
                b[k+j*ldb] = b[k+j*ldb] * a[k+k*lda];
              }
              for ( i = k + 1; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * a[i+k*lda];
              }
            }
          }
        }
      }
    }
//
//  Form  B := alpha*A'*B.
//
    else
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          for ( i = m - 1; 0 <= i; i-- )
          {
            temp = b[i+j*ldb];
            if ( nounit )
            {
              temp = temp * a[i+i*lda];
            }
            for ( k = 0; k < i; k++ )
            {
              temp = temp + a[k+i*lda] * b[k+j*ldb];
            }
            b[i+j*ldb] = alpha * temp;
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          for ( i = 0; i < m; i++ )
          {
            temp = b[i+j*ldb];
            if ( nounit )
            {
              temp = temp * a[i+i*lda];
            }
            for ( k = i + 1; k < m; k++ )
            {
              temp = temp + a[k+i*lda] * b[k+j*ldb];
            }
            b[i+j*ldb] = alpha * temp;
          }
        }
      }
    }
  }
//
//  Form  B := alpha*B*A.
//
  else
  {
    if ( lsame ( transa, 'n' ) )
    {
      if ( upper )
      {
        for ( j = n - 1; 0 <= j; j-- )
        {
          temp = alpha;
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = 0; i < m; i++ )
          {
            b[i+j*ldb] = temp * b[i+j*ldb];
          }
          for ( k = 0; k < j; k++ )
          {
            if ( a[k+j*lda] != 0.0 )
            {
              temp = alpha * a[k+j*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * b[i+k*ldb];
              }
            }
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          temp = alpha;
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = 0; i < m; i++ )
          {
            b[i+j*ldb] = temp * b[i+j*ldb];
          }
          for ( k = j + 1; k < n; k++ )
          {
            if ( a[k+j*lda] != 0.0 )
            {
              temp = alpha * a[k+j*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * b[i+k*ldb];
              }
            }
          }
        }
      }
    }
//
//  Form  B := alpha*B*A'.
//
    else
    {
      if ( upper )
      {
        for ( k = 0; k < n; k++ )
        {
          for ( j = 0; j < k; j++ )
          {
            if ( a[j+k*lda] != 0.0 )
            {
              temp = alpha * a[j+k*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * b[i+k*ldb];
              }
            }
          }
          temp = alpha;
          if ( nounit )
          {
            temp = temp * a[k+k*lda];
          }
          if ( temp != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = temp * b[i+k*ldb];
            }
          }
        }
      }
      else
      {
        for ( k = n - 1; 0 <= k; k-- )
        {
          for ( j = k + 1; j < n; j++ )
          {
            if ( a[j+k*lda] != 0.0 )
            {
              temp = alpha * a[j+k*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * b[i+k*ldb];
              }
            }
          }
          temp = alpha;
          if ( nounit )
          {
            temp = temp * a[k+k*lda];
          }
          if ( temp != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = temp * b[i+k*ldb];
            }
          }
        }
      }
    }
  }
  return;
}